

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeRefTest(TranslateToFuzzReader *this,Type type)

{
  uint32_t uVar1;
  BasicHeapType BVar2;
  BasicHeapType BVar3;
  Expression *ref;
  RefTest *pRVar4;
  HeapType local_40;
  HeapType local_38;
  Type local_30;
  Type refType;
  Type castType;
  
  if (type.id != 2) {
    __assert_fail("type == Type::i32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x12a4,"Expression *wasm::TranslateToFuzzReader::makeRefTest(Type)");
  }
  if ((~(this->wasm->features).features & 0x500) != 0) {
    __assert_fail("wasm.features.hasReferenceTypes() && wasm.features.hasGC()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x12a5,"Expression *wasm::TranslateToFuzzReader::makeRefTest(Type)");
  }
  local_30.id = 0;
  refType.id = 0;
  uVar1 = Random::upTo(&this->random,3);
  if (uVar1 == 2) {
    refType = getReferenceType(this);
    local_30 = getSubType(this,refType);
  }
  else {
    if (uVar1 != 1) {
      if (uVar1 != 0) {
        wasm::handle_unreachable
                  ("bad case",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                   ,0x12c2);
      }
      local_30 = getReferenceType(this);
      refType = getReferenceType(this);
      local_40 = Type::getHeapType(&local_30);
      BVar2 = HeapType::getBottom(&local_40);
      local_38 = Type::getHeapType(&refType);
      BVar3 = HeapType::getBottom(&local_38);
      if (BVar2 == BVar3) goto LAB_00155723;
    }
    local_30 = getReferenceType(this);
    refType = getSubType(this,local_30);
  }
LAB_00155723:
  ref = make(this,local_30);
  pRVar4 = Builder::makeRefTest(&this->builder,ref,refType);
  return (Expression *)pRVar4;
}

Assistant:

Expression* TranslateToFuzzReader::makeRefTest(Type type) {
  assert(type == Type::i32);
  assert(wasm.features.hasReferenceTypes() && wasm.features.hasGC());
  // The case of the reference and the cast type having a connection is useful,
  // so give a decent chance for one to be a subtype of the other.
  Type refType, castType;
  switch (upTo(3)) {
    case 0:
      // Totally random.
      refType = getReferenceType();
      castType = getReferenceType();
      // They must share a bottom type in order to validate.
      if (refType.getHeapType().getBottom() ==
          castType.getHeapType().getBottom()) {
        break;
      }
      // Otherwise, fall through and generate things in a way that is
      // guaranteed to validate.
      [[fallthrough]];
    case 1:
      // Cast is a subtype of ref.
      refType = getReferenceType();
      castType = getSubType(refType);
      break;
    case 2:
      // Ref is a subtype of cast.
      castType = getReferenceType();
      refType = getSubType(castType);
      break;
    default:
      // This unreachable avoids a warning on refType being possibly undefined.
      WASM_UNREACHABLE("bad case");
  }
  return builder.makeRefTest(make(refType), castType);
}